

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

int Ssw_SmlNodeIsZero(Ssw_Sml_t *p,Aig_Obj_t *pObj)

{
  long lVar1;
  long lVar2;
  
  lVar2 = (long)p->nWordsPref;
  do {
    if (p->nWordsTotal <= lVar2) {
      return 1;
    }
    lVar1 = lVar2 * 4;
    lVar2 = lVar2 + 1;
  } while (*(int *)((long)&p[1].pAig + lVar1 + (long)(pObj->Id * p->nWordsTotal) * 4) == 0);
  return 0;
}

Assistant:

int Ssw_SmlNodeIsZero( Ssw_Sml_t * p, Aig_Obj_t * pObj )
{
    unsigned * pSims;
    int i;
    pSims = Ssw_ObjSim(p, pObj->Id);
    for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
        if ( pSims[i] )
            return 0;
    return 1;
}